

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall crnlib::crn_comp::optimize_color(crn_comp *this)

{
  int *piVar1;
  uint8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  endpoint_indices_details *peVar7;
  uint8 uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long *pData_ptr;
  executable_task *pObj;
  uint uVar13;
  uint temp_4;
  uint uVar14;
  ulong uVar15;
  undefined2 uVar16;
  uint uVar17;
  unsigned_short *temp_3;
  unsigned_short *puVar19;
  unsigned_short *puVar20;
  uint uVar21;
  uint temp_1;
  uchar *temp;
  uchar *puVar22;
  uchar *puVar23;
  long lVar24;
  undefined4 *puVar25;
  uint uVar26;
  uint min_new_capacity;
  dxt1_block *pdVar27;
  uint i;
  uint64 data;
  vector<unsigned_int> sum;
  vector<crnlib::optimize_color_params::unpacked_endpoint> unpacked_endpoints;
  vector<unsigned_int> hist;
  result remapping_trial [4];
  elemental_vector local_128;
  elemental_vector local_118;
  elemental_vector local_108;
  undefined8 uStack_f8;
  undefined8 local_f0;
  executable_task local_e8;
  undefined8 local_e0;
  dxt1_block local_d8;
  uint8 auStack_d0 [8];
  uint8 auStack_c8 [8];
  uint8 auStack_c0 [144];
  ulong uVar18;
  
  uVar10 = (this->m_color_endpoints).m_size;
  local_e0 = (ulong)uVar10;
  uVar9 = (ushort)uVar10;
  local_108.m_p = (void *)0x0;
  local_108.m_size = 0;
  local_108.m_capacity = 0;
  if ((ulong)uVar9 != 0) {
    uVar17 = (uVar10 & 0xffff) * (uVar10 & 0xffff);
    elemental_vector::increase_capacity(&local_108,uVar17,uVar17 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_108._8_8_ & 0xffffffff) * 4 + (long)local_108.m_p),0,
           (ulong)(uVar17 - local_108.m_size) << 2);
    local_108.m_size = uVar17;
  }
  local_128.m_p = (void *)0x0;
  local_128.m_size = 0;
  local_128.m_capacity = 0;
  uVar26 = uVar10 & 0xffff;
  min_new_capacity = uVar10 & 0xffff;
  if (uVar26 != 0) {
    elemental_vector::increase_capacity(&local_128,uVar26,uVar26 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_128._8_8_ & 0xffffffff) * 4 + (long)local_128.m_p),0,
           (ulong)(min_new_capacity - local_128.m_size) << 2);
    local_128._8_8_ = CONCAT44(local_128.m_capacity,uVar10) & 0xffffffff0000ffff;
  }
  if ((this->m_endpoint_indices).m_size != 0) {
    uVar12 = 0;
    uVar26 = 0;
    do {
      peVar7 = (this->m_endpoint_indices).m_p;
      uVar13 = (uint)peVar7[uVar12].field_0.field_0.color;
      uVar2 = peVar7[uVar12].reference;
      uVar8 = uVar2;
      if (this->m_has_subblocks == false) {
        uVar8 = uVar2 == '\0';
      }
      if ((uVar12 & 1) == 0) {
        uVar8 = uVar2 == '\0';
      }
      if ((uVar8 != '\0') && (uVar26 != uVar13)) {
        piVar1 = (int *)((long)local_108.m_p + (ulong)(min_new_capacity * uVar13 + uVar26) * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_108.m_p + (ulong)(uVar26 * min_new_capacity + uVar13) * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_128.m_p + (ulong)uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_128.m_p + (ulong)uVar26 * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar12 = uVar12 + 1;
      uVar26 = uVar13;
    } while (uVar12 < (this->m_endpoint_indices).m_size);
  }
  uVar26 = 0;
  if ((uVar10 & 0xffff) == 0) {
    uVar16 = 0;
  }
  else {
    uVar15 = 0;
    uVar12 = 0;
    do {
      uVar13 = *(uint *)((long)local_128.m_p + uVar15 * 4);
      uVar18 = uVar15 & 0xffffffff;
      if (uVar13 <= uVar26) {
        uVar18 = uVar12;
      }
      uVar16 = (undefined2)uVar18;
      if (uVar26 <= uVar13) {
        uVar26 = uVar13;
      }
      uVar15 = uVar15 + 1;
      uVar12 = uVar18;
    } while (uVar9 != uVar15);
  }
  local_118.m_p = (void *)0x0;
  local_118.m_size = 0;
  local_118.m_capacity = 0;
  if ((uVar10 & 0xffff) != 0) {
    elemental_vector::increase_capacity
              (&local_118,min_new_capacity,min_new_capacity == 1,8,
               vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover,false);
    local_118._8_8_ = CONCAT44(local_118.m_capacity,uVar10) & 0xffffffff0000ffff;
    lVar24 = 0;
    do {
      uVar10 = (this->m_color_endpoints).m_p[lVar24];
      if (this->m_has_etc_color_blocks == true) {
        uVar10 = uVar10 & 0xffffff;
      }
      else {
        dxt1_block::unpack_color(&local_d8,(uint16)uVar10,true,0xff);
        uVar10 = local_d8._0_4_;
      }
      *(uint *)((long)local_118.m_p + lVar24 * 8) = uVar10;
      uVar10 = (this->m_color_endpoints).m_p[lVar24];
      if (this->m_has_etc_color_blocks == true) {
        uVar10 = uVar10 >> 0x18;
      }
      else {
        dxt1_block::unpack_color(&local_d8,(uint16)(uVar10 >> 0x10),true,0xff);
        uVar10 = local_d8._0_4_;
      }
      *(uint *)((long)local_118.m_p + lVar24 * 8 + 4) = uVar10;
      lVar24 = lVar24 + 1;
    } while ((ushort)lVar24 < uVar9);
  }
  lVar24 = 0;
  do {
    *(undefined8 *)((&local_d8)[2].m_low_color + lVar24) = 0;
    *(undefined8 *)((&local_d8)[3].m_low_color + lVar24) = 0;
    *(undefined8 *)(local_d8.m_low_color + lVar24) = 0;
    *(undefined8 *)((&local_d8)[1].m_low_color + lVar24) = 0;
    lVar24 = lVar24 + 0x28;
  } while (lVar24 != 0xa0);
  local_f0 = &this->m_task_pool;
  puVar25 = &DAT_001ba5e0;
  pdVar27 = &local_d8;
  data = 0;
  local_e8._vptr_executable_task = (_func_int **)&PTR_execute_task_001de8a8;
  do {
    pData_ptr = (long *)crnlib_malloc(0x20);
    *pData_ptr = (long)local_118.m_p;
    pData_ptr[1] = (long)local_108.m_p;
    *(short *)(pData_ptr + 2) = (short)local_e0;
    *(undefined2 *)((long)pData_ptr + 0x12) = uVar16;
    *(undefined4 *)((long)pData_ptr + 0x14) = *puVar25;
    pData_ptr[3] = (long)pdVar27;
    pObj = (executable_task *)crnlib_malloc(0x28);
    pObj->_vptr_executable_task = local_e8._vptr_executable_task;
    pObj[1]._vptr_executable_task = (_func_int **)this;
    pObj[2]._vptr_executable_task = (_func_int **)optimize_color_endpoints_task;
    pObj[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
    task_pool::queue_task(local_f0,pObj,data,pData_ptr);
    data = data + 1;
    puVar25 = puVar25 + 1;
    pdVar27 = pdVar27 + 5;
  } while (data != 4);
  task_pool::join(local_f0);
  uVar17 = (this->m_packed_color_endpoints).m_size;
  uVar21 = (this->m_packed_color_endpoints).m_capacity;
  uVar14 = this->m_endpoint_remaping[0].m_size;
  uVar11 = this->m_endpoint_remaping[0].m_capacity;
  uVar10 = 0xffffffff;
  lVar24 = 0x20;
  puVar19 = this->m_endpoint_remaping[0].m_p;
  puVar22 = (this->m_packed_color_endpoints).m_p;
  do {
    uVar26 = *(uint *)(local_d8.m_low_color + lVar24);
    puVar20 = puVar19;
    puVar23 = puVar22;
    if (uVar26 < uVar10) {
      puVar23 = *(uchar **)((long)&local_e8._vptr_executable_task + lVar24);
      (this->m_packed_color_endpoints).m_p = puVar23;
      *(uchar **)((long)&local_e8._vptr_executable_task + lVar24) = puVar22;
      uVar3 = *(uint *)((&local_d8)[-1].m_low_color + lVar24);
      (this->m_packed_color_endpoints).m_size = uVar3;
      *(uint *)((&local_d8)[-1].m_low_color + lVar24) = uVar17;
      uVar4 = *(uint *)(local_d8.m_low_color + lVar24 + -4);
      (this->m_packed_color_endpoints).m_capacity = uVar4;
      *(uint *)(local_d8.m_low_color + lVar24 + -4) = uVar21;
      puVar20 = *(unsigned_short **)((long)&uStack_f8 + lVar24);
      this->m_endpoint_remaping[0].m_p = puVar20;
      *(unsigned_short **)((long)&uStack_f8 + lVar24) = puVar19;
      uVar5 = *(uint *)((long)&local_f0 + lVar24);
      this->m_endpoint_remaping[0].m_size = uVar5;
      *(uint *)((long)&local_f0 + lVar24) = uVar14;
      uVar6 = *(uint *)((long)&local_f0 + lVar24 + 4);
      this->m_endpoint_remaping[0].m_capacity = uVar6;
      *(uint *)((long)&local_f0 + lVar24 + 4) = uVar11;
      uVar17 = uVar3;
      uVar21 = uVar4;
      uVar14 = uVar5;
      uVar11 = uVar6;
      uVar10 = uVar26;
    }
    lVar24 = lVar24 + 0x28;
    puVar19 = puVar20;
    puVar22 = puVar23;
  } while (lVar24 != 0xc0);
  lVar24 = 0x78;
  do {
    if (*(void **)((&local_d8)[2].m_low_color + lVar24) != (void *)0x0) {
      crnlib_free(*(void **)((&local_d8)[2].m_low_color + lVar24));
    }
    if (*(void **)(local_d8.m_low_color + lVar24) != (void *)0x0) {
      crnlib_free(*(void **)(local_d8.m_low_color + lVar24));
    }
    lVar24 = lVar24 + -0x28;
  } while (lVar24 != -0x28);
  if (local_118.m_p != (void *)0x0) {
    crnlib_free(local_118.m_p);
  }
  if (local_128.m_p != (void *)0x0) {
    crnlib_free(local_128.m_p);
  }
  if (local_108.m_p != (void *)0x0) {
    crnlib_free(local_108.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color() {
  uint16 n = m_color_endpoints.size();
  crnlib::vector<uint> hist(n * n);
  crnlib::vector<uint> sum(n);
  for (uint i, i_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i_prev = i) {
    i = m_endpoint_indices[b].color;
    if ((m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) && i != i_prev) {
      hist[i * n + i_prev]++;
      hist[i_prev * n + i]++;
      sum[i]++;
      sum[i_prev]++;
    }
  }
  uint16 selected = 0;
  uint best_sum = 0;
  for (uint16 i = 0; i < n; i++) {
    if (best_sum < sum[i]) {
      best_sum = sum[i];
      selected = i;
    }
  }
  crnlib::vector<optimize_color_params::unpacked_endpoint> unpacked_endpoints(n);
  for (uint16 i = 0; i < n; i++) {
    unpacked_endpoints[i].low.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] & 0xFFFFFF : dxt1_block::unpack_color(m_color_endpoints[i] & 0xFFFF, true).m_u32;
    unpacked_endpoints[i].high.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] >> 24 : dxt1_block::unpack_color(m_color_endpoints[i] >> 16, true).m_u32;
  }

  optimize_color_params::result remapping_trial[4];
  float weights[4] = {0, 0, 1.0f / 6.0f, 0.5f};
  for (uint i = 0; i < 4; i++) {
    optimize_color_params* pParams = crnlib_new<optimize_color_params>();
    pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
    pParams->hist = hist.get_ptr();
    pParams->n = n;
    pParams->selected = selected;
    pParams->weight = weights[i];
    pParams->pResult = remapping_trial + i;
    m_task_pool.queue_object_task(this, &crn_comp::optimize_color_endpoints_task, i, pParams);
  }
  m_task_pool.join();

  for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++) {
    if (remapping_trial[i].total_bits < best_bits) {
      m_packed_color_endpoints.swap(remapping_trial[i].packed_endpoints);
      m_endpoint_remaping[cColor].swap(remapping_trial[i].endpoint_remapping);
      best_bits = remapping_trial[i].total_bits;
    }
  }
}